

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

void gl4cts::CopyImage::Utils::readChannel
               (GLenum type,GLuint channel,GLubyte *pixel,GLdouble *value)

{
  Float<unsigned_long,_11,_52,_1023,_3U> FVar1;
  TestError *this;
  GLdouble GVar2;
  Float16 val;
  Float<unsigned_short,_5,_10,_15,_3U> local_12;
  
  if ((int)type < 0x8032) {
    switch(type) {
    case 0x1400:
      GVar2 = (double)(int)(char)pixel[channel] / 127.0;
      break;
    case 0x1401:
      GVar2 = (double)pixel[channel] / 255.0;
      break;
    case 0x1402:
      GVar2 = (double)(int)*(short *)(pixel + (ulong)channel * 2) / 32767.0;
      break;
    case 0x1403:
      GVar2 = (double)*(ushort *)(pixel + (ulong)channel * 2) / 65535.0;
      break;
    case 0x1404:
      GVar2 = (double)*(int *)(pixel + (ulong)channel * 4) / 2147483647.0;
      break;
    case 0x1405:
      GVar2 = (double)*(uint *)(pixel + (ulong)channel * 4) / 4294967295.0;
      break;
    case 0x1406:
      GVar2 = (GLdouble)*(float *)(pixel + (ulong)channel * 4);
      break;
    default:
      goto switchD_0086f328_caseD_1407;
    case 0x140b:
      FVar1 = tcu::Float<unsigned_long,11,52,1023,3u>::convert<unsigned_short,5,10,15,3u>(&local_12)
      ;
      *value = (GLdouble)FVar1.m_value;
      return;
    }
    *value = GVar2;
    return;
  }
  if ((int)type < 0x8363) {
    if (type == 0x8032) {
      read3Channel<unsigned_char,3u,3u,2u,5u,2u,0u>(channel,pixel,value);
      return;
    }
    if (type == 0x8033) {
      read4Channel<unsigned_short,4u,4u,4u,4u,12u,8u,4u,0u>(channel,pixel,value);
      return;
    }
    if (type == 0x8034) {
      read4Channel<unsigned_short,5u,5u,5u,1u,11u,6u,1u,0u>(channel,pixel,value);
      return;
    }
  }
  else if ((int)type < 0x8c3b) {
    if (type == 0x8363) {
      read3Channel<unsigned_short,5u,6u,5u,11u,5u,0u>(channel,pixel,value);
      return;
    }
    if (type == 0x8368) {
      read4Channel<unsigned_int,2u,10u,10u,10u,30u,20u,10u,0u>(3 - channel,pixel,value);
      return;
    }
  }
  else {
    if (type == 0x8c3b) {
      read11F_11F_10F_Channel(channel,pixel,value);
      return;
    }
    if (type == 0x8c3e) {
      read4Channel<unsigned_int,5u,9u,9u,9u,27u,18u,9u,0u>(3 - channel,pixel,value);
      return;
    }
  }
switchD_0086f328_caseD_1407:
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
             ,0x923);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Utils::readChannel(GLenum type, GLuint channel, const GLubyte* pixel, GLdouble& value)
{
	switch (type)
	{
	/* Base types */
	case GL_UNSIGNED_BYTE:
		readBaseTypeFromUnsignedChannel<GLubyte>(channel, pixel, value);
		break;
	case GL_UNSIGNED_SHORT:
		readBaseTypeFromUnsignedChannel<GLushort>(channel, pixel, value);
		break;
	case GL_UNSIGNED_INT:
		readBaseTypeFromUnsignedChannel<GLuint>(channel, pixel, value);
		break;
	case GL_BYTE:
		readBaseTypeFromSignedChannel<GLbyte>(channel, pixel, value);
		break;
	case GL_SHORT:
		readBaseTypeFromSignedChannel<GLshort>(channel, pixel, value);
		break;
	case GL_INT:
		readBaseTypeFromSignedChannel<GLint>(channel, pixel, value);
		break;
	case GL_HALF_FLOAT:
		readBaseTypeFromHalfFloatChannel(channel, pixel, value);
		break;
	case GL_FLOAT:
		readBaseTypeFromFloatChannel(channel, pixel, value);
		break;

	/* Complicated */
	/* 3 channles */
	case GL_UNSIGNED_BYTE_3_3_2:
		read3Channel<GLubyte, 3, 3, 2, 5, 2, 0>(channel, pixel, value);
		break;
	case GL_UNSIGNED_SHORT_5_6_5:
		read3Channel<GLushort, 5, 6, 5, 11, 5, 0>(channel, pixel, value);
		break;

	/* 4 channels */
	case GL_UNSIGNED_SHORT_4_4_4_4:
		read4Channel<GLushort, 4, 4, 4, 4, 12, 8, 4, 0>(channel, pixel, value);
		break;
	case GL_UNSIGNED_SHORT_5_5_5_1:
		read4Channel<GLushort, 5, 5, 5, 1, 11, 6, 1, 0>(channel, pixel, value);
		break;
	case GL_UNSIGNED_INT_2_10_10_10_REV:
		read4Channel<GLuint, 2, 10, 10, 10, 30, 20, 10, 0>(3 - channel, pixel, value);
		break;
	case GL_UNSIGNED_INT_5_9_9_9_REV:
		read4Channel<GLuint, 5, 9, 9, 9, 27, 18, 9, 0>(3 - channel, pixel, value);
		break;

	/* R11F_G11F_B10F - uber complicated */
	case GL_UNSIGNED_INT_10F_11F_11F_REV:
		read11F_11F_10F_Channel(channel, pixel, value);
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}
}